

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O0

void test_service_names(void)

{
  uint16_t uVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nni_resolv_item item;
  undefined1 local_98 [2];
  uint16_t local_96;
  uint32_t port;
  nng_sockaddr sa;
  nng_aio *aio;
  
  memset(&result__1,0,0x20);
  nVar2 = nng_aio_alloc((nng_aio **)(sa.s_storage.sa_pad + 0xf),(_func_void_void_ptr *)0x0,
                        (void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x8d,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  result__1 = NNG_EINVAL;
  item._0_8_ = anon_var_dwarf_44f;
  item.ri_host._0_2_ = 0x50;
  result_._0_1_ = NNG_EINTR;
  item._16_8_ = local_98;
  nni_resolv((nni_resolv_item *)&result__1,(nni_aio *)sa.s_storage.sa_pad[0xf]);
  nng_aio_wait((nng_aio *)sa.s_storage.sa_pad[0xf]);
  nVar2 = nng_aio_result((nng_aio *)sa.s_storage.sa_pad[0xf]);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x95,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  uVar1 = nuts_be16(0x50);
  acutest_check_((uint)(local_96 == uVar1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x96,"%s","sa.s_in.sa_port == nuts_be16(80)");
  port = nuts_be32(0x8080404);
  acutest_check_((uint)(port != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x97,"%s","sa.s_in.sa_addr = nuts_be32(0x08080404)");
  nng_aio_free((nng_aio *)sa.s_storage.sa_pad[0xf]);
  nVar2 = nni_get_port_by_name("http",(uint32_t *)((long)&item.ri_sa + 4));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x9a,"%s: expected success, got %s (%d)",
                         "nni_get_port_by_name(\"http\", &port)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(item.ri_sa._4_4_ == 0x50),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x9b,"%s","port == 80");
  nVar2 = nni_get_port_by_name("25",(uint32_t *)((long)&item.ri_sa + 4));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x9d,"%s: expected success, got %s (%d)",
                         "nni_get_port_by_name(\"25\", &port)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(item.ri_sa._4_4_ == 0x19),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                 ,0x9e,"%s","port == 25");
  return;
}

Assistant:

void
test_service_names(void)
{
	nng_aio        *aio;
	nng_sockaddr    sa;
	uint32_t        port;
	nni_resolv_item item = { 0 };

	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	item.ri_family  = NNG_AF_INET;
	item.ri_host    = "8.8.4.4";
	item.ri_port    = 80;
	item.ri_passive = true;
	item.ri_sa      = &sa;
	nni_resolv(&item, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));
	NUTS_TRUE(sa.s_in.sa_port == nuts_be16(80));
	NUTS_TRUE(sa.s_in.sa_addr = nuts_be32(0x08080404));
	nng_aio_free(aio);

	NUTS_PASS(nni_get_port_by_name("http", &port));
	NUTS_TRUE(port == 80);

	NUTS_PASS(nni_get_port_by_name("25", &port));
	NUTS_TRUE(port == 25);
}